

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coulombic_energy_compute.cpp
# Opt level: O0

void __thiscall CoulombicEnergyCompute::upward_pass(CoulombicEnergyCompute *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  value_type_conflict2 vVar4;
  ulong uVar5;
  int iVar6;
  size_type sVar7;
  reference pvVar8;
  size_t sVar9;
  reference pvVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  double *pdVar14;
  long lVar15;
  long in_RDI;
  undefined1 *puVar16;
  double extraout_XMM0_Qa;
  double dVar17;
  Tree *extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  array<unsigned_long,_2UL> aVar18;
  double numerator;
  double dist_z_1;
  double dist_y_1;
  double dist_x_1;
  size_t i_3;
  double q_temp;
  double w3;
  double cz;
  double w2;
  double cy;
  double w1;
  double cx;
  size_t kk;
  int k3;
  int k2;
  int k1;
  double dist_z;
  double dist_y;
  double dist_x;
  int j;
  double zz;
  double yy;
  double xx;
  double denominator_z;
  double denominator_y;
  double denominator_x;
  size_t i_2;
  size_t i_1;
  double *denominator_ptr;
  int *exact_idx_z_ptr;
  int *exact_idx_y_ptr;
  int *exact_idx_x_ptr;
  vector<double,_std::allocator<double>_> denominator;
  vector<int,_std::allocator<int>_> exact_idx_z;
  vector<int,_std::allocator<int>_> exact_idx_y;
  vector<int,_std::allocator<int>_> exact_idx_x;
  size_t num_particles;
  size_t particle_start;
  size_t node_charges_start;
  size_t node_interp_pts_start;
  array<unsigned_long,_2UL> particle_idxs;
  size_t node_idx;
  int i;
  int weights_num;
  double *weights_ptr;
  vector<double,_std::allocator<double>_> weights;
  double *mol_clusters_q_ptr;
  double *mol_clusters_z_ptr;
  double *mol_clusters_y_ptr;
  double *mol_clusters_x_ptr;
  double *mol_q_ptr;
  double *mol_z_ptr;
  double *mol_y_ptr;
  double *mol_x_ptr;
  int num_mol_interp_charges_per_node;
  int num_mol_interp_pts_per_node;
  double in_stack_fffffffffffffd08;
  Tree *in_stack_fffffffffffffd10;
  allocator_type *in_stack_fffffffffffffd20;
  undefined1 *in_stack_fffffffffffffd28;
  allocator_type *in_stack_fffffffffffffd30;
  double local_240;
  allocator_type *local_220;
  double local_218;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1ac;
  double local_190;
  double local_188;
  double local_180;
  allocator_type *local_178;
  allocator_type *local_170;
  undefined1 local_141;
  undefined1 local_140 [120];
  allocator_type *local_c8;
  value_type_conflict2 local_c0;
  long local_b8;
  long local_b0;
  _Type local_a8;
  ulong local_98;
  int local_90;
  int local_8c;
  double *local_88;
  vector<double,_std::allocator<double>_> local_68;
  double *local_50;
  double *local_48;
  double *local_40;
  double *local_38;
  double *local_30;
  double *local_28;
  double *local_20;
  double *local_18;
  int local_10;
  int local_c;
  
  local_c = *(int *)(in_RDI + 0x38);
  local_10 = *(int *)(in_RDI + 0x3c);
  local_18 = Particles::x_ptr((Particles *)0x11b32c);
  local_20 = Particles::y_ptr((Particles *)0x11b348);
  local_28 = Particles::z_ptr((Particles *)0x11b364);
  local_30 = Molecule::charge_ptr((Molecule *)0x11b380);
  local_38 = InterpolationPoints::interp_x_ptr((InterpolationPoints *)0x11b39c);
  local_40 = InterpolationPoints::interp_y_ptr((InterpolationPoints *)0x11b3b8);
  local_48 = InterpolationPoints::interp_z_ptr((InterpolationPoints *)0x11b3d4);
  local_50 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x11b3ed);
  std::allocator<double>::allocator((allocator<double> *)0x11b41a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd30,
             (size_type)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  std::allocator<double>::~allocator((allocator<double> *)0x11b446);
  local_88 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x11b453);
  sVar7 = std::vector<double,_std::allocator<double>_>::size(&local_68);
  local_8c = (int)sVar7;
  for (local_90 = 0; local_90 < local_8c; local_90 = local_90 + 1) {
    iVar6 = -1;
    if (local_90 % 2 == 0) {
      iVar6 = 1;
    }
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_68,(long)local_90);
    *pvVar8 = (double)iVar6;
    if ((local_90 == 0) || (local_90 == local_8c + -1)) {
      iVar6 = -1;
      if (local_90 % 2 == 0) {
        iVar6 = 1;
      }
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_68,(long)local_90);
      *pvVar8 = (double)iVar6 * 0.5;
    }
  }
  local_98 = 0;
  while( true ) {
    uVar5 = local_98;
    sVar9 = Tree::num_nodes(*(Tree **)(in_RDI + 8));
    if (sVar9 <= uVar5) break;
    aVar18 = Tree::node_particle_idxs(in_stack_fffffffffffffd10,(size_t)in_stack_fffffffffffffd08);
    local_b0 = local_98 * (long)local_c;
    local_b8 = local_98 * (long)local_10;
    local_a8 = aVar18._M_elems;
    pvVar10 = std::array<unsigned_long,_2UL>::operator[]
                        ((array<unsigned_long,_2UL> *)in_stack_fffffffffffffd10,
                         (size_type)in_stack_fffffffffffffd08);
    local_c0 = *pvVar10;
    pvVar10 = std::array<unsigned_long,_2UL>::operator[]
                        ((array<unsigned_long,_2UL> *)in_stack_fffffffffffffd10,
                         (size_type)in_stack_fffffffffffffd08);
    vVar4 = *pvVar10;
    pvVar10 = std::array<unsigned_long,_2UL>::operator[]
                        ((array<unsigned_long,_2UL> *)in_stack_fffffffffffffd10,
                         (size_type)in_stack_fffffffffffffd08);
    local_c8 = (allocator_type *)(vVar4 - *pvVar10);
    std::allocator<int>::allocator((allocator<int> *)0x11b6e1);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30,
               (size_type)in_stack_fffffffffffffd28,(allocator_type *)in_stack_fffffffffffffd20);
    std::allocator<int>::~allocator((allocator<int> *)0x11b707);
    std::allocator<int>::allocator((allocator<int> *)0x11b726);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30,
               (size_type)in_stack_fffffffffffffd28,(allocator_type *)in_stack_fffffffffffffd20);
    std::allocator<int>::~allocator((allocator<int> *)0x11b74c);
    in_stack_fffffffffffffd30 = local_c8;
    std::allocator<int>::allocator((allocator<int> *)0x11b76b);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30,
               (size_type)in_stack_fffffffffffffd28,(allocator_type *)in_stack_fffffffffffffd20);
    std::allocator<int>::~allocator((allocator<int> *)0x11b791);
    in_stack_fffffffffffffd28 = &local_141;
    in_stack_fffffffffffffd20 = local_c8;
    std::allocator<double>::allocator((allocator<double> *)0x11b7b0);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd30,
               (size_type)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    std::allocator<double>::~allocator((allocator<double> *)0x11b7d6);
    piVar11 = std::vector<int,_std::allocator<int>_>::data
                        ((vector<int,_std::allocator<int>_> *)0x11b7e3);
    piVar12 = std::vector<int,_std::allocator<int>_>::data
                        ((vector<int,_std::allocator<int>_> *)0x11b7f8);
    piVar13 = std::vector<int,_std::allocator<int>_>::data
                        ((vector<int,_std::allocator<int>_> *)0x11b80d);
    puVar16 = local_140;
    pdVar14 = std::vector<double,_std::allocator<double>_>::data
                        ((vector<double,_std::allocator<double>_> *)0x11b822);
    for (local_170 = (allocator_type *)0x0; local_170 < local_c8; local_170 = local_170 + 1) {
      piVar11[(long)local_170] = -1;
      piVar12[(long)local_170] = -1;
      piVar13[(long)local_170] = -1;
    }
    for (local_178 = (allocator_type *)0x0; local_178 < local_c8; local_178 = local_178 + 1) {
      local_180 = 0.0;
      local_188 = 0.0;
      local_190 = 0.0;
      dVar1 = local_18[(long)(local_178 + local_c0)];
      dVar2 = local_20[(long)(local_178 + local_c0)];
      dVar3 = local_28[(long)(local_178 + local_c0)];
      for (local_1ac = 0; local_1ac < local_c; local_1ac = local_1ac + 1) {
        local_180 = local_180 + local_88[local_1ac] / (dVar1 - local_38[local_b0 + local_1ac]);
        local_188 = local_188 + local_88[local_1ac] / (dVar2 - local_40[local_b0 + local_1ac]);
        local_190 = local_190 + local_88[local_1ac] / (dVar3 - local_48[local_b0 + local_1ac]);
        std::abs((int)puVar16);
        dVar17 = std::numeric_limits<double>::min();
        if (extraout_XMM0_Qa < dVar17) {
          piVar11[(long)local_178] = local_1ac;
        }
        std::abs((int)puVar16);
        in_stack_fffffffffffffd10 = extraout_XMM0_Qa_00;
        dVar17 = std::numeric_limits<double>::min();
        if ((double)in_stack_fffffffffffffd10 < dVar17) {
          piVar12[(long)local_178] = local_1ac;
        }
        std::abs((int)puVar16);
        in_stack_fffffffffffffd08 = extraout_XMM0_Qa_01;
        dVar17 = std::numeric_limits<double>::min();
        if (in_stack_fffffffffffffd08 < dVar17) {
          piVar13[(long)local_178] = local_1ac;
        }
      }
      pdVar14[(long)local_178] = 1.0;
      if (piVar11[(long)local_178] == -1) {
        pdVar14[(long)local_178] = pdVar14[(long)local_178] / local_180;
      }
      if (piVar12[(long)local_178] == -1) {
        pdVar14[(long)local_178] = pdVar14[(long)local_178] / local_188;
      }
      if (piVar13[(long)local_178] == -1) {
        pdVar14[(long)local_178] = pdVar14[(long)local_178] / local_190;
      }
    }
    for (local_1cc = 0; local_1cc < local_c; local_1cc = local_1cc + 1) {
      for (local_1d0 = 0; local_1d0 < local_c; local_1d0 = local_1d0 + 1) {
        for (local_1d4 = 0; local_1d4 < local_c; local_1d4 = local_1d4 + 1) {
          lVar15 = local_b8 + local_1cc * local_c * local_c + (long)(local_1d0 * local_c) +
                   (long)local_1d4;
          local_218 = 0.0;
          for (local_220 = (allocator_type *)0x0; local_220 < local_c8; local_220 = local_220 + 1) {
            local_240 = 1.0;
            if (piVar11[(long)local_220] == -1) {
              local_240 = (local_88[local_1cc] /
                          (local_18[(long)(local_220 + local_c0)] - local_38[local_b0 + local_1cc]))
                          * 1.0;
            }
            else if (piVar11[(long)local_220] != local_1cc) {
              local_240 = 0.0;
            }
            if (piVar12[(long)local_220] == -1) {
              local_240 = (local_88[local_1d0] /
                          (local_20[(long)(local_220 + local_c0)] - local_40[local_b0 + local_1d0]))
                          * local_240;
            }
            else if (piVar12[(long)local_220] != local_1d0) {
              local_240 = local_240 * 0.0;
            }
            if (piVar13[(long)local_220] == -1) {
              local_240 = (local_88[local_1d4] /
                          (local_28[(long)(local_220 + local_c0)] - local_48[local_b0 + local_1d4]))
                          * local_240;
            }
            else if (piVar13[(long)local_220] != local_1d4) {
              local_240 = local_240 * 0.0;
            }
            local_218 = local_30[(long)(local_220 + local_c0)] * local_240 *
                        pdVar14[(long)local_220] + local_218;
          }
          local_50[lVar15] = local_218 + local_50[lVar15];
        }
      }
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd20);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd20);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd20);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd20);
    local_98 = local_98 + 1;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd20);
  return;
}

Assistant:

void CoulombicEnergyCompute::upward_pass()
{
//    timers_.upward_pass.start();

    int num_mol_interp_pts_per_node     = num_mol_interp_pts_per_node_;
    int num_mol_interp_charges_per_node = num_mol_interp_charges_per_node_;
    
    const double* __restrict mol_x_ptr = molecule_.x_ptr();
    const double* __restrict mol_y_ptr = molecule_.y_ptr();
    const double* __restrict mol_z_ptr = molecule_.z_ptr();
    
    const double* __restrict mol_q_ptr = molecule_.charge_ptr();
    
    const double* __restrict mol_clusters_x_ptr = mol_interp_pts_.interp_x_ptr();
    const double* __restrict mol_clusters_y_ptr = mol_interp_pts_.interp_y_ptr();
    const double* __restrict mol_clusters_z_ptr = mol_interp_pts_.interp_z_ptr();
    
    double*       __restrict mol_clusters_q_ptr = mol_interp_charge_.data();
    
        
    std::vector<double> weights (num_mol_interp_pts_per_node);
    double* weights_ptr = weights.data();
    int weights_num = weights.size();
    
    for (int i = 0; i < weights_num; ++i) {
        weights[i] = ((i % 2 == 0)? 1 : -1);
        if (i == 0 || i == weights_num-1) weights[i] = ((i % 2 == 0)? 1 : -1) * 0.5;
    }

    
#ifdef OPENACC_ENABLED
    #pragma acc enter data copyin(weights_ptr[0:weights_num])
#endif
    
    for (std::size_t node_idx = 0; node_idx < source_tree_.num_nodes(); ++node_idx) {
        
        auto particle_idxs = source_tree_.node_particle_idxs(node_idx);
        
        std::size_t node_interp_pts_start = node_idx * num_mol_interp_pts_per_node;
        std::size_t node_charges_start    = node_idx * num_mol_interp_charges_per_node;
        
        std::size_t particle_start = particle_idxs[0];
        std::size_t num_particles  = particle_idxs[1] - particle_idxs[0];
        
        std::vector<int> exact_idx_x(num_particles);
        std::vector<int> exact_idx_y(num_particles);
        std::vector<int> exact_idx_z(num_particles);
        std::vector<double> denominator(num_particles);
        
        int* exact_idx_x_ptr = exact_idx_x.data();
        int* exact_idx_y_ptr = exact_idx_y.data();
        int* exact_idx_z_ptr = exact_idx_z.data();
        double* denominator_ptr = denominator.data();
        
#ifdef OPENACC_ENABLED
#pragma acc kernels present(mol_x_ptr, mol_y_ptr, mol_z_ptr, mol_q_ptr, \
                            mol_clusters_x_ptr, mol_clusters_y_ptr, mol_clusters_z_ptr, \
                            mol_clusters_q_ptr, weights_ptr) \
                  create(exact_idx_x_ptr[0:num_particles], exact_idx_y_ptr[0:num_particles], \
                         exact_idx_z_ptr[0:num_particles], denominator_ptr[0:num_particles])
#endif
        {

#ifdef OPENACC_ENABLED
        #pragma acc loop vector(32) independent
#endif
        for (std::size_t i = 0; i < num_particles; ++i) {
            exact_idx_x_ptr[i] = -1;
            exact_idx_y_ptr[i] = -1;
            exact_idx_z_ptr[i] = -1;
        }

#ifdef OPENACC_ENABLED
        #pragma acc loop independent
#endif
        for (std::size_t i = 0; i < num_particles; ++i) {
        
            double denominator_x = 0.;
            double denominator_y = 0.;
            double denominator_z = 0.;
            
            double xx = mol_x_ptr[particle_start + i];
            double yy = mol_y_ptr[particle_start + i];
            double zz = mol_z_ptr[particle_start + i];

            // because there's a reduction over exact_idx[i], this loop carries a
            // backward dependence and won't actually parallelize
#ifdef OPENACC_ENABLED
            #pragma acc loop reduction(+:denominator_x,denominator_y,denominator_z)
#endif
            for (int j = 0; j < num_mol_interp_pts_per_node; ++j) {
            
                double dist_x = xx - mol_clusters_x_ptr[node_interp_pts_start + j];
                double dist_y = yy - mol_clusters_y_ptr[node_interp_pts_start + j];
                double dist_z = zz - mol_clusters_z_ptr[node_interp_pts_start + j];
                
                denominator_x += weights_ptr[j] / dist_x;
                denominator_y += weights_ptr[j] / dist_y;
                denominator_z += weights_ptr[j] / dist_z;
                
                if (std::abs(dist_x) < std::numeric_limits<double>::min()) exact_idx_x_ptr[i] = j;
                if (std::abs(dist_y) < std::numeric_limits<double>::min()) exact_idx_y_ptr[i] = j;
                if (std::abs(dist_z) < std::numeric_limits<double>::min()) exact_idx_z_ptr[i] = j;
            }
            
            denominator_ptr[i] = 1.0;
            if (exact_idx_x_ptr[i] == -1) denominator_ptr[i] /= denominator_x;
            if (exact_idx_y_ptr[i] == -1) denominator_ptr[i] /= denominator_y;
            if (exact_idx_z_ptr[i] == -1) denominator_ptr[i] /= denominator_z;
        }

#ifdef OPENACC_ENABLED
        #pragma acc loop collapse(3) independent
#endif
        for (int k1 = 0; k1 < num_mol_interp_pts_per_node; ++k1) {
        for (int k2 = 0; k2 < num_mol_interp_pts_per_node; ++k2) {
        for (int k3 = 0; k3 < num_mol_interp_pts_per_node; ++k3) {
        
            std::size_t kk = node_charges_start
                   + k1 * num_mol_interp_pts_per_node * num_mol_interp_pts_per_node
                   + k2 * num_mol_interp_pts_per_node + k3;
                   
            double cx = mol_clusters_x_ptr[node_interp_pts_start + k1];
            double w1 = weights_ptr[k1];

            double cy = mol_clusters_y_ptr[node_interp_pts_start + k2];
            double w2 = weights_ptr[k2];
            
            double cz = mol_clusters_z_ptr[node_interp_pts_start + k3];
            double w3 = weights_ptr[k3];
            
            double q_temp = 0.;
            
#ifdef OPENACC_ENABLED
            #pragma acc loop reduction(+:q_temp)
#endif
            for (std::size_t i = 0; i < num_particles; i++) {  // loop over source points
            
                double dist_x = mol_x_ptr[particle_start + i] - cx;
                double dist_y = mol_y_ptr[particle_start + i] - cy;
                double dist_z = mol_z_ptr[particle_start + i] - cz;
                
                double numerator = 1.;

                // If exact_idx[i] == -1, then no issues.
                // If exact_idx[i] != -1, then we want to zero out terms EXCEPT when exactInd=k1.
                if (exact_idx_x_ptr[i] == -1) {
                    numerator *= w1 / dist_x;
                } else {
                    if (exact_idx_x_ptr[i] != k1) numerator *= 0.;
                }

                if (exact_idx_y_ptr[i] == -1) {
                    numerator *= w2 / dist_y;
                } else {
                    if (exact_idx_y_ptr[i] != k2) numerator *= 0.;
                }

                if (exact_idx_z_ptr[i] == -1) {
                    numerator *= w3 / dist_z;
                } else {
                    if (exact_idx_z_ptr[i] != k3) numerator *= 0.;
                }

                q_temp += mol_q_ptr[particle_start + i] * numerator * denominator_ptr[i];
            }
            
            mol_clusters_q_ptr[kk] += q_temp;
        }
        }
        }
        
        } // end parallel region
    } // end loop over nodes
#ifdef OPENACC_ENABLED
    #pragma acc exit data delete(weights_ptr[0:weights_num])
#endif

//    timers_.upward_pass.stop();
}